

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPExternalTransmitter::SetMaximumPacketSize(RTPExternalTransmitter *this,size_t s)

{
  int iVar1;
  
  iVar1 = -0x97;
  if ((this->init == true) && (iVar1 = -0x96, this->created == true)) {
    this->maxpacksize = s;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int RTPExternalTransmitter::SetMaximumPacketSize(size_t s)	
{
	if (!init)
		return ERR_RTP_EXTERNALTRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_NOTCREATED;
	}
	maxpacksize = s;
	MAINMUTEX_UNLOCK
	return 0;
}